

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFLogger.cc
# Opt level: O0

void __thiscall QPDFLogger::setSave(QPDFLogger *this,shared_ptr<Pipeline> *p,bool only_if_not_set)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  logic_error *this_00;
  element_type *peVar4;
  Pl_Track *local_58;
  Pl_Track *pt;
  bool only_if_not_set_local;
  shared_ptr<Pipeline> *p_local;
  QPDFLogger *this_local;
  
  if (only_if_not_set) {
    peVar2 = std::__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    bVar1 = std::operator!=(&peVar2->p_save,(nullptr_t)0x0);
    if (bVar1) {
      return;
    }
  }
  peVar2 = std::__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  bVar1 = std::operator==(&peVar2->p_save,p);
  if (!bVar1) {
    peVar2 = std::__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    bVar1 = std::operator==(p,&peVar2->p_stdout);
    if (bVar1) {
      peVar3 = std::__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>::get
                         (&p->super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>);
      if (peVar3 == (element_type *)0x0) {
        local_58 = (Pl_Track *)0x0;
      }
      else {
        local_58 = (Pl_Track *)
                   __dynamic_cast(peVar3,&Pipeline::typeinfo,
                                  &(anonymous_namespace)::Pl_Track::typeinfo,0);
      }
      bVar1 = anon_unknown.dwarf_33a681::Pl_Track::getUsed(local_58);
      if (bVar1) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (this_00,
                   "QPDFLogger: called setSave on standard output after standard output has already been used"
                  );
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      peVar2 = std::
               __shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      peVar4 = std::
               __shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      bVar1 = std::operator==(&peVar2->p_info,&peVar4->p_stdout);
      if (bVar1) {
        peVar2 = std::
                 __shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        peVar4 = std::
                 __shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        std::shared_ptr<Pipeline>::operator=(&peVar4->p_info,&peVar2->p_stderr);
      }
      QUtil::binary_stdout();
    }
    peVar2 = std::__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::shared_ptr<Pipeline>::operator=(&peVar2->p_save,p);
  }
  return;
}

Assistant:

void
QPDFLogger::setSave(std::shared_ptr<Pipeline> p, bool only_if_not_set)
{
    if (only_if_not_set && (m->p_save != nullptr)) {
        return;
    }
    if (m->p_save == p) {
        return;
    }
    if (p == m->p_stdout) {
        auto pt = dynamic_cast<Pl_Track*>(p.get());
        if (pt->getUsed()) {
            throw std::logic_error(
                "QPDFLogger: called setSave on standard output after standard"
                " output has already been used");
        }
        if (m->p_info == m->p_stdout) {
            m->p_info = m->p_stderr;
        }
        QUtil::binary_stdout();
    }
    m->p_save = p;
}